

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

bool wasm::hasActiveSegments(Module *wasm)

{
  size_type sVar1;
  reference this;
  pointer pDVar2;
  uint local_1c;
  Index i;
  Module *wasm_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&wasm->dataSegments);
    if (sVar1 <= local_1c) {
      return false;
    }
    this = std::
           vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ::operator[](&wasm->dataSegments,(ulong)local_1c);
    pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (this);
    if ((pDVar2->isPassive & 1U) == 0) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool hasActiveSegments(Module& wasm) {
  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    if (!wasm.dataSegments[i]->isPassive) {
      return true;
    }
  }
  return false;
}